

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.h
# Opt level: O1

Ray * __thiscall
PerspectiveCamera::generateRay(Ray *__return_storage_ptr__,PerspectiveCamera *this,Vector2f *point)

{
  float *pfVar1;
  float fVar2;
  Vector3f newDir;
  Vector3f local_6c;
  Vector3f local_60;
  Vector3f local_54;
  Vector3f local_48;
  Vector3f local_3c;
  
  fVar2 = tanf(this->_angle * 0.5);
  ::operator*(1.0 / fVar2,&local_48);
  pfVar1 = Vector2f::operator[](point,0);
  ::operator*(*pfVar1,&local_54);
  operator+(&local_48,&local_54);
  pfVar1 = Vector2f::operator[](point,1);
  ::operator*(*pfVar1,&local_60);
  operator+(&local_6c,&local_60);
  Vector3f::normalized(&local_6c);
  Vector3f::operator=(&local_3c,&local_6c);
  Vector3f::Vector3f(&__return_storage_ptr__->_origin,&this->_center);
  Vector3f::Vector3f(&__return_storage_ptr__->_direction,&local_3c);
  return __return_storage_ptr__;
}

Assistant:

Ray generateRay(const Vector2f &point) override {
        // BEGIN STARTER
        float d = 1.0f / (float) std::tan(_angle / 2.0f);
        Vector3f newDir = d * _direction + point[0] * _horizontal + point[1] * _up;
        newDir = newDir.normalized();

        return Ray(_center, newDir);
        // END STARTER
    }